

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

int __thiscall QMenuPrivate::init(QMenuPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  int iVar1;
  QAction *pQVar2;
  undefined4 *puVar3;
  QStyle *pQVar4;
  QMenuScroller *pQVar5;
  long in_FS_OFFSET;
  QObject local_50 [8];
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QWidget::setAttribute(this_00,WA_CustomWhatsThis,true);
  QWidget::setAttribute(this_00,WA_X11NetWmWindowTypePopupMenu,true);
  pQVar2 = (QAction *)operator_new(0x10);
  QAction::QAction(pQVar2,&this_00->super_QObject);
  this->menuAction = pQVar2;
  this->defaultMenuAction = pQVar2;
  QAction::setMenuObject((QObject *)pQVar2);
  QObject::disconnect((QObject *)this->menuAction,"2destroyed()",
                      *(QObject **)&(this->super_QWidgetPrivate).field_0x8,
                      "1_q_overrideMenuActionDestroyed()");
  pQVar2 = this->defaultMenuAction;
  this->menuAction = pQVar2;
  local_48 = QAction::changed;
  local_40 = 0;
  puVar3 = (undefined4 *)operator_new(0x18);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qmenu.cpp:168:56),_QtPrivate::List<>,_void>
       ::impl;
  *(QMenuPrivate **)(puVar3 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)pQVar2,(QObject *)&local_48,(void **)this_00,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  pQVar4 = QWidget::style(this_00);
  iVar1 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x14,0,this_00,0);
  QWidget::setAttribute(this_00,WA_MouseTracking,iVar1 != 0);
  pQVar4 = QWidget::style(this_00);
  iVar1 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x1e,0,this_00,0);
  if (iVar1 != 0) {
    pQVar5 = (QMenuScroller *)operator_new(0xc);
    pQVar5->scrollOffset = 0;
    pQVar5->scrollTimer = Invalid;
    pQVar5->scrollFlags = '\0';
    pQVar5->scrollDirection = '\0';
    this->scroll = pQVar5;
    pQVar5->scrollFlags = '\0';
  }
  QMenuSloppyState::initialize(&this->sloppyState,(QMenu *)this_00);
  (this->delayState).parent = (QMenu *)this_00;
  pQVar4 = QWidget::style(this_00);
  iVar1 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x10,0,this_00,0);
  this->mousePopupDelay = iVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::init()
{
    Q_Q(QMenu);
#if QT_CONFIG(whatsthis)
    q->setAttribute(Qt::WA_CustomWhatsThis);
#endif
    q->setAttribute(Qt::WA_X11NetWmWindowTypePopupMenu);
    defaultMenuAction = menuAction = new QAction(q);
    menuAction->setMenu(q); // this calls setOverrideMenuAction
    setOverrideMenuAction(nullptr);
    QObject::connect(menuAction, &QAction::changed, q, [this] {
        if (!tornPopup.isNull())
            tornPopup->updateWindowTitle();
    });
    q->setMouseTracking(q->style()->styleHint(QStyle::SH_Menu_MouseTracking, nullptr, q));
    if (q->style()->styleHint(QStyle::SH_Menu_Scrollable, nullptr, q)) {
        scroll = new QMenuPrivate::QMenuScroller;
        scroll->scrollFlags = QMenuPrivate::QMenuScroller::ScrollNone;
    }

    sloppyState.initialize(q);
    delayState.initialize(q);
    mousePopupDelay = q->style()->styleHint(QStyle::SH_Menu_SubMenuPopupDelay, nullptr, q);
}